

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O1

void __thiscall blockchain_tests::num_chain_tx_max::test_method(num_chain_tx_max *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined8 local_190;
  lazy_ostream local_188;
  undefined1 *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined8 *local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined1 *local_130;
  undefined8 **local_128;
  long *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  long **local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  undefined1 local_d0 [80];
  long local_80 [9];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_d0,0,0x98);
  local_80[0] = -1;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000075;
  file.m_begin = (iterator)&local_158;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_168,msg);
  local_188.m_empty = false;
  local_188._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_148 = &local_190;
  local_190 = 0xffffffffffffffff;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_80[0] == -1);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_f0 = "";
  local_100 = &local_120;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013abb70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013abb70;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_120 = local_80;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_188,1,2,REQUIRE,0xe6264c,(size_t)&local_f8,0x75,&local_118,
             "std::numeric_limits<uint64_t>::max()",&local_140);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(num_chain_tx_max)
{
    CBlockIndex block_index{};
    block_index.m_chain_tx_count = std::numeric_limits<uint64_t>::max();
    BOOST_CHECK_EQUAL(block_index.m_chain_tx_count, std::numeric_limits<uint64_t>::max());
}